

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppcnn.cpp
# Opt level: O2

void __thiscall
CppCNN::backprop_conv
          (CppCNN *this,MatrixXd *delta_prev_fc,AllLayersValuesBatch *Z_batch,
          AllLayersValuesBatch *A_batch)

{
  pointer pvVar1;
  pointer pvVar2;
  pointer psVar3;
  long *plVar4;
  long lVar5;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pPVar6;
  int iVar7;
  CppCNN *this_00;
  long lVar8;
  long lVar9;
  long lVar10;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_e0;
  VectorXd v_delta_prev_fc;
  ImageVolume DeltaPrev;
  element_type *local_88;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Stack_80;
  int local_78;
  pointer local_48;
  pointer puStack_40;
  int local_38;
  
  pvVar1 = (A_batch->
           super__Vector_base<std::vector<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>,_std::allocator<std::vector<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  DeltaPrev.
  super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  DeltaPrev.
  super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  DeltaPrev.
  super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar8 = *(long *)&((pvVar1[-1].
                      super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    )._M_impl.super__Vector_impl_data;
  pvVar2 = pvVar1[-1].
           super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_48 = *(pointer *)(lVar8 + 8);
  puStack_40 = *(pointer *)(lVar8 + 0x10);
  local_38 = (int)(((long)pvVar2[-1].
                          super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)pvVar2[-1].
                         super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 0x18);
  for (lVar8 = 0;
      lVar8 < (delta_prev_fc->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
              m_storage.m_cols; lVar8 = lVar8 + 1) {
    Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
              ((Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)
               &stack0xffffffffffffff78,delta_prev_fc,lVar8);
    this_00 = (CppCNN *)&stack0xffffffffffffff78;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,true>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&v_delta_prev_fc,
               (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                *)&stack0xffffffffffffff78);
    unflatten_layer((LayerValues *)&stack0xffffffffffffff78,this_00,&v_delta_prev_fc,
                    (LayerSize *)&stack0xffffffffffffffb8);
    std::
    vector<std::vector<Eigen::Matrix<double,-1,-1,0,-1,-1>,std::allocator<Eigen::Matrix<double,-1,-1,0,-1,-1>>>,std::allocator<std::vector<Eigen::Matrix<double,-1,-1,0,-1,-1>,std::allocator<Eigen::Matrix<double,-1,-1,0,-1,-1>>>>>
    ::
    emplace_back<std::vector<Eigen::Matrix<double,_1,_1,0,_1,_1>,std::allocator<Eigen::Matrix<double,_1,_1,0,_1,_1>>>>
              ((vector<std::vector<Eigen::Matrix<double,_1,_1,0,_1,_1>,std::allocator<Eigen::Matrix<double,_1,_1,0,_1,_1>>>,std::allocator<std::vector<Eigen::Matrix<double,_1,_1,0,_1,_1>,std::allocator<Eigen::Matrix<double,_1,_1,0,_1,_1>>>>>
                *)&DeltaPrev,
               (vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                *)&stack0xffffffffffffff78);
    std::
    vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
    ::~vector((vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
               *)&stack0xffffffffffffff78);
    free(v_delta_prev_fc.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
         m_data);
  }
  lVar9 = (long)(this->__layers).
                super__Vector_base<std::shared_ptr<LayerBase>,_std::allocator<std::shared_ptr<LayerBase>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->__layers).
                super__Vector_base<std::shared_ptr<LayerBase>,_std::allocator<std::shared_ptr<LayerBase>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  lVar10 = lVar9 >> 4;
  lVar8 = lVar10 * 0x18;
  do {
    if (lVar10 < 1) {
      std::
      vector<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>_>
      ::~vector(&DeltaPrev);
      return;
    }
    psVar3 = (this->__layers).
             super__Vector_base<std::shared_ptr<LayerBase>,_std::allocator<std::shared_ptr<LayerBase>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar7 = (**(code **)(**(long **)((long)&psVar3[-1].
                                            super___shared_ptr<LayerBase,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_ptr + lVar9) + 0x20))();
    if (iVar7 == 1) {
      std::dynamic_pointer_cast<LayerConv,LayerBase>((shared_ptr<LayerBase> *)&local_e0);
      LayerConv::compute_gradients
                ((LayerConv *)local_e0.m_storage.m_data,
                 (ImageVolume *)
                 ((long)&(A_batch->
                         super__Vector_base<std::vector<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>,_std::allocator<std::vector<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start[-1].
                         super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
                         ._M_impl.super__Vector_impl_data + lVar8),&DeltaPrev);
      pvVar1 = (Z_batch->
               super__Vector_base<std::vector<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>,_std::allocator<std::vector<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      plVar4 = *(long **)((long)&pvVar1[-1].
                                 super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data + lVar8);
      lVar5 = *plVar4;
      local_88 = *(element_type **)(lVar5 + 8);
      _Stack_80._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar5 + 0x10);
      local_78 = (int)((plVar4[1] - lVar5) / 0x18);
      LayerConv::convolution_backward
                ((ImageVolume *)&v_delta_prev_fc,(LayerConv *)local_e0.m_storage.m_data,&DeltaPrev,
                 (ImageVolume *)
                 ((long)&pvVar1[-1].
                         super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
                         ._M_impl.super__Vector_impl_data + lVar8),
                 (LayerSize *)&stack0xffffffffffffff78);
      std::
      vector<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>_>
      ::_M_move_assign(&DeltaPrev,(ImageVolume *)&v_delta_prev_fc);
      std::
      vector<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>_>
      ::~vector((ImageVolume *)&v_delta_prev_fc);
      pPVar6 = &local_e0;
LAB_0013a1c1:
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(pPVar6->m_storage).m_rows);
    }
    else {
      iVar7 = (**(code **)(**(long **)((long)&psVar3[-1].
                                              super___shared_ptr<LayerBase,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_ptr + lVar9) + 0x20))();
      if (iVar7 == 2) {
        std::dynamic_pointer_cast<LayerPool,LayerBase>((shared_ptr<LayerBase> *)&v_delta_prev_fc);
        LayerPool::unpool((ImageVolume *)&stack0xffffffffffffff78,
                          (LayerPool *)
                          v_delta_prev_fc.
                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                          m_data,&DeltaPrev);
        std::
        vector<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>_>
        ::_M_move_assign(&DeltaPrev,(LayerSize *)&stack0xffffffffffffff78);
        std::
        vector<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>_>
        ::~vector((vector<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
                   *)&stack0xffffffffffffff78);
        pPVar6 = &v_delta_prev_fc.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>;
        goto LAB_0013a1c1;
      }
    }
    lVar10 = lVar10 + -1;
    lVar8 = lVar8 + -0x18;
    lVar9 = lVar9 + -0x10;
  } while( true );
}

Assistant:

void CppCNN::backprop_conv(const MatrixXd& delta_prev_fc, 
							 const AllLayersValuesBatch& Z_batch, const AllLayersValuesBatch& A_batch) {
	auto& A = A_batch.back();
	auto& Z = Z_batch.back();

	ImageVolume DeltaPrev;
	auto& lv_fc = A[0][0]; // one of layer values before fully-connected layer.
	auto lv_fc_sz = LayerSize(lv_fc.rows(), lv_fc.cols(), A.back().size());
	for (auto i = 0; i < delta_prev_fc.cols(); i++) {
		VectorXd v_delta_prev_fc = delta_prev_fc.col(i);
		DeltaPrev.push_back(unflatten_layer(v_delta_prev_fc, lv_fc_sz));
	}
	
	for (int64_t i = __layers.size() - 1; i >= 0; i--) {
		auto& p_layer = __layers[i];
		if (is_conv_layer(*p_layer)) {
			const auto& layer_conv = dynamic_pointer_cast<LayerConv>(p_layer);

			layer_conv->compute_gradients(A_batch[i], DeltaPrev);

			// compute next layer's dZ from current layer's dZ, direction : dZ^{l-1} <-- dZ^{l}
			auto& img = Z_batch[i][0][0];
			auto next_layer_size = LayerSize(img.rows(), img.cols(), Z_batch[i][0].size());
			DeltaPrev = layer_conv->convolution_backward(DeltaPrev, Z_batch[i], next_layer_size);
		}
		else if (is_pool_layer(*p_layer)) {
			const auto& layer_pool = dynamic_pointer_cast<LayerPool>(p_layer);
			DeltaPrev = layer_pool->unpool(DeltaPrev);
		}
	}
}